

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O0

void __thiscall
CVmDynamicFunc::restore_from_file
          (CVmDynamicFunc *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  uint uVar1;
  CVmVarHeap *pCVar2;
  vm_dynfunc_ext *this_00;
  char *buf_00;
  vm_val_t *in_RDI;
  uint ofs;
  int i;
  char *bc;
  vm_dynfunc_ext *ext;
  int obj_ref_cnt;
  size_t bytecode_len;
  char buf [5];
  vm_obj_id_t obj;
  uint in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int iVar3;
  char *in_stack_ffffffffffffffb8;
  CVmDynamicFunc *in_stack_ffffffffffffffc0;
  
  if ((in_RDI->val).ptr != (void *)0x0) {
    pCVar2 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar2->_vptr_CVmVarHeap[6])(pCVar2,(in_RDI->val).ptr);
  }
  CVmFile::read_uint2((CVmFile *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  uVar1 = CVmFile::read_uint2((CVmFile *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  this_00 = vm_dynfunc_ext::alloc_ext
                      (in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8,
                       in_stack_ffffffffffffffb4);
  (in_RDI->val).native_desc = (CVmNativeCodeDesc *)this_00;
  CVmFile::read_bytes((CVmFile *)this_00,in_stack_ffffffffffffffb8,
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  CVmObjFixup::fix_dh((CVmObjFixup *)this_00,in_stack_ffffffffffffffb8);
  vmb_get_dh((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI);
  CVmFile::read_bytes((CVmFile *)this_00,in_stack_ffffffffffffffb8,
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  CVmObjFixup::fix_dh((CVmObjFixup *)this_00,in_stack_ffffffffffffffb8);
  vmb_get_dh((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI);
  obj = (vm_obj_id_t)((ulong)in_RDI >> 0x20);
  vm_dynfunc_ext::get_prefix_ptr(this_00);
  vmb_put_objid((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),obj);
  buf_00 = vm_dynfunc_ext::get_bytecode_ptr((vm_dynfunc_ext *)0x2dba55);
  CVmFile::read_bytes((CVmFile *)this_00,buf_00,
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  for (iVar3 = 0; iVar3 < (int)uVar1; iVar3 = iVar3 + 1) {
    in_stack_ffffffffffffffb0 =
         CVmFile::read_uint2((CVmFile *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
    this_00->obj_refs[iVar3] = in_stack_ffffffffffffffb0;
    CVmObjFixup::fix_vmb_obj((CVmObjFixup *)this_00,buf_00);
  }
  return;
}

Assistant:

void CVmDynamicFunc::restore_from_file(VMG_ vm_obj_id_t self,
                                       CVmFile *fp, CVmObjFixup *fixups)
{
    char buf[VMB_DATAHOLDER];
    
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* read the bytecode length and object reference count */
    size_t bytecode_len = fp->read_uint2();
    int obj_ref_cnt = fp->read_uint2();

    /* allocate the extension */
    vm_dynfunc_ext *ext = vm_dynfunc_ext::alloc_ext(
        vmg_ this, bytecode_len, obj_ref_cnt);
    ext_ = (char *)ext;

    /* read the method context object */
    fp->read_bytes(buf, VMB_DATAHOLDER);
    fixups->fix_dh(vmg_ buf);
    vmb_get_dh(buf, &ext->method_ctx);

    /* read the source object */
    fp->read_bytes(buf, VMB_DATAHOLDER);
    fixups->fix_dh(vmg_ buf);
    vmb_get_dh(buf, &ext->src);

    /* set up the dynamic object code prefix header */
    vmb_put_objid(ext->get_prefix_ptr(), self);

    /* read the bytecode */
    char *bc = ext->get_bytecode_ptr();
    fp->read_bytes(bc, bytecode_len);

    /* read the object references, fixing each one up in the bytecode */
    for (int i = 0 ; i < obj_ref_cnt ; ++i)
    {
        /* read and save the offset of this reference */
        uint ofs = ext->obj_refs[i] = fp->read_uint2();

        /* fix up the object ID in the bytecode data */
        fixups->fix_vmb_obj(vmg_ bc + ofs);
    }
}